

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

bool __thiscall FIntermissionActionFader::ParseKey(FIntermissionActionFader *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  int v;
  FadeType FT [3];
  FScanner *sc_local;
  FIntermissionActionFader *this_local;
  
  memcpy(&stack0xffffffffffffffa8,&DAT_009ec820,0x30);
  bVar1 = FScanner::Compare(sc,"FadeType");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,(char **)&stack0xffffffffffffffa8,0x10);
    if (iVar2 != -1) {
      this->mFadeType = *(EFadeType *)&FT[iVar2].Name;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
  }
  return this_local._7_1_;
}

Assistant:

bool FIntermissionActionFader::ParseKey(FScanner &sc)
{
	struct FadeType
	{
		const char *Name;
		EFadeType Type;
	}
	const FT[] = {
		{ "FadeIn", FADE_In },
		{ "FadeOut", FADE_Out },
		{ NULL, FADE_In }
	};

	if (sc.Compare("FadeType"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&FT[0].Name, sizeof(FT[0]));
		if (v != -1) mFadeType = FT[v].Type;
		return true;
	}
	else return Super::ParseKey(sc);
}